

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_text.c
# Opt level: O3

void canvas_howputnew(_glist *x,int *connectp,int *xpixp,int *ypixp,int *indexp,int *totalp)

{
  t_selection *ptVar1;
  t_gobj *x_00;
  int iVar2;
  t_gobj *ptVar3;
  int iVar4;
  int iVar5;
  int x1;
  int y2;
  int y1;
  int x2;
  int local_5c;
  int *local_58;
  int *local_50;
  int *local_48;
  int local_3c;
  int local_38;
  int local_34;
  
  iVar4 = sys_noautopatch;
  ptVar1 = x->gl_editor->e_selection;
  local_58 = connectp;
  local_50 = indexp;
  if ((ptVar1 == (t_selection *)0x0) || (ptVar1->sel_next != (_selection *)0x0)) {
    glist_nograb(x);
  }
  else {
    iVar2 = x->gl_zoom;
    glist_nograb(x);
    if (iVar4 == 0) {
      ptVar3 = x->gl_list;
      if (ptVar3 == (t_gobj *)0x0) {
        iVar4 = 0;
      }
      else {
        iVar4 = 0;
        do {
          iVar4 = iVar4 + 1;
          ptVar3 = ptVar3->g_next;
        } while (ptVar3 != (_gobj *)0x0);
      }
      ptVar3 = x->gl_editor->e_selection->sel_what;
      local_48 = totalp;
      glist_noselect(x);
      if (x->gl_list == (t_gobj *)0x0) {
        glist_getnextxy(x,xpixp,ypixp);
        *xpixp = *xpixp / x->gl_zoom + -3;
        iVar2 = *ypixp / x->gl_zoom + -3;
        iVar5 = 0;
      }
      else {
        iVar5 = 0;
        x_00 = x->gl_list;
        while (x_00 != ptVar3) {
          if (x_00->g_next == (_gobj *)0x0) {
            iVar5 = iVar4 + -1;
            break;
          }
          iVar5 = iVar5 + 1;
          x_00 = x_00->g_next;
        }
        gobj_getrect(x_00,x,&local_5c,&local_38,&local_34,&local_3c);
        *xpixp = local_5c / x->gl_zoom;
        iVar2 = (int)(((float)iVar2 * 5.5 + (float)local_3c) / (float)x->gl_zoom);
      }
      *ypixp = iVar2;
      iVar2 = 1;
      totalp = local_48;
      goto LAB_0015de42;
    }
  }
  glist_getnextxy(x,xpixp,ypixp);
  *xpixp = *xpixp / x->gl_zoom + -3;
  *ypixp = *ypixp / x->gl_zoom + -3;
  glist_noselect(x);
  iVar2 = 0;
  iVar4 = 0;
  iVar5 = 0;
LAB_0015de42:
  *local_58 = iVar2;
  *local_50 = iVar5;
  *totalp = iVar4;
  return;
}

Assistant:

static void canvas_howputnew(t_canvas *x, int *connectp, int *xpixp, int *ypixp,
    int *indexp, int *totalp)
{
    float dx = 5.5 * x->gl_zoom;
    int xpix, ypix, indx = 0, nobj = 0, n2, x1, x2, y1, y2;
    int connectme = (x->gl_editor->e_selection &&
        !x->gl_editor->e_selection->sel_next && !sys_noautopatch);
    glist_nograb(x);
    if (connectme)
    {
        t_gobj *g, *selected = x->gl_editor->e_selection->sel_what;
            /* get number of objects */
        for (g = x->gl_list, nobj = 0; g; g = g->g_next, nobj++) ;

            /* deselect the current selection (and create pending objects) */
        glist_noselect(x);

            /* search back for 'selected' and if it isn't on the list,
                plan just to connect from the last item on the list. */
        for (g = x->gl_list, n2 = 0; g; g = g->g_next, n2++)
        {
            if (g == selected)
            {
                indx = n2;
                break;
            }
            else if (!g->g_next) {
                    /* we couldn't find the selected object any more
                     * this probably means, that it was replaced by a newly
                     * created object, which is now the last on the list.
                     */
                indx = nobj-1;
                break;
            }
        }
            /* so where do we put the new object?
               just below the one we connect from! */
        if(g) {
            gobj_getrect(g, x, &x1, &y1, &x2, &y2);
            *xpixp = x1 / x->gl_zoom;
            *ypixp = (y2+dx) / x->gl_zoom;  /* 5 pixels down, rounded */
        } else {
                /* just in case */
            glist_getnextxy(x, xpixp, ypixp);
            *xpixp = *xpixp/x->gl_zoom - 3;
            *ypixp = *ypixp/x->gl_zoom - 3;
        }
    }
    else
    {
        glist_getnextxy(x, xpixp, ypixp);
        *xpixp = *xpixp/x->gl_zoom - 3;
        *ypixp = *ypixp/x->gl_zoom - 3;
        glist_noselect(x);
    }
    *connectp = connectme;
    *indexp = indx;
    *totalp = nobj;
}